

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Option<Catch::TagAlias>::Option(Option<Catch::TagAlias> *this,TagAlias *_value)

{
  TagAlias::TagAlias((TagAlias *)this->storage,_value);
  this->nullableValue = (TagAlias *)this->storage;
  return;
}

Assistant:

Option( T const& _value )
        : nullableValue( new( storage ) T( _value ) )
        {}